

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

size_t __thiscall CLI::App::remaining_size(App *this,bool recurse)

{
  bool bVar1;
  const_iterator cVar2;
  const_iterator cVar3;
  __shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_00;
  element_type *this_01;
  size_t sVar4;
  App_p *sub;
  const_iterator __end3;
  const_iterator __begin3;
  vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_> *__range3;
  size_t local_20;
  size_t remaining_options;
  bool recurse_local;
  App *this_local;
  
  cVar2 = ::std::
          begin<std::vector<std::pair<CLI::detail::Classifier,std::__cxx11::string>,std::allocator<std::pair<CLI::detail::Classifier,std::__cxx11::string>>>>
                    (&this->missing_);
  cVar3 = ::std::
          end<std::vector<std::pair<CLI::detail::Classifier,std::__cxx11::string>,std::allocator<std::pair<CLI::detail::Classifier,std::__cxx11::string>>>>
                    (&this->missing_);
  local_20 = ::std::
             count_if<__gnu_cxx::__normal_iterator<std::pair<CLI::detail::Classifier,std::__cxx11::string>const*,std::vector<std::pair<CLI::detail::Classifier,std::__cxx11::string>,std::allocator<std::pair<CLI::detail::Classifier,std::__cxx11::string>>>>,CLI::App::remaining_size(bool)const::_lambda(std::pair<CLI::detail::Classifier,std::__cxx11::string>const&)_1_>
                       (cVar2._M_current,cVar3._M_current);
  if (recurse) {
    __end3 = std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>::
             begin(&this->subcommands_);
    sub = (App_p *)std::
                   vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>::
                   end(&this->subcommands_);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<const_std::shared_ptr<CLI::App>_*,_std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>_>
                                       *)&sub), bVar1) {
      this_00 = (__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                __gnu_cxx::
                __normal_iterator<const_std::shared_ptr<CLI::App>_*,_std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>_>
                ::operator*(&__end3);
      this_01 = std::__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->(this_00);
      sVar4 = remaining_size(this_01,recurse);
      local_20 = sVar4 + local_20;
      __gnu_cxx::
      __normal_iterator<const_std::shared_ptr<CLI::App>_*,_std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>_>
      ::operator++(&__end3);
    }
  }
  return local_20;
}

Assistant:

std::size_t remaining_size(bool recurse = false) const {
        auto remaining_options = static_cast<std::size_t>(std::count_if(
            std::begin(missing_), std::end(missing_), [](const std::pair<detail::Classifier, std::string> &val) {
                return val.first != detail::Classifier::POSITIONAL_MARK;
            }));

        if(recurse) {
            for(const App_p &sub : subcommands_) {
                remaining_options += sub->remaining_size(recurse);
            }
        }
        return remaining_options;
    }